

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O2

void multikey_cache4(uchar **strings,size_t n)

{
  Cacheblock<4U>_conflict *cache;
  uchar **ppuVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  
  cache = (Cacheblock<4U>_conflict *)malloc(n << 4);
  ppuVar1 = &cache->ptr;
  for (sVar3 = 0; n != sVar3; sVar3 = sVar3 + 1) {
    *ppuVar1 = strings[sVar3];
    ppuVar1 = ppuVar1 + 2;
  }
  multikey_cache<4u,true>(cache,n,0);
  lVar2 = 4;
  while (bVar4 = n != 0, n = n - 1, bVar4) {
    *(undefined8 *)((long)strings + lVar2 + -4) =
         *(undefined8 *)((long)&cache->cached_bytes + lVar2 * 2);
    lVar2 = lVar2 + 8;
  }
  free(cache);
  return;
}

Assistant:

void multikey_cache4(unsigned char** strings, size_t n)
{ multikey_cache<4>(strings, n, 0); }